

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O1

void Sendrecv(IceTCommunicator self,void *sendbuf,int sendcount,IceTEnum sendtype,int dest,
             int sendtag,void *recvbuf,int recvcount,IceTEnum recvtype,int src,int recvtag)

{
  undefined *puVar1;
  undefined *puVar2;
  
  if (sendtype - 0x8000 < 6) {
    puVar2 = (&PTR_ompi_mpi_byte_00123d70)[sendtype - 0x8000];
  }
  else {
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x12e);
    puVar2 = &ompi_mpi_byte;
  }
  if (recvtype - 0x8000 < 6) {
    puVar1 = (&PTR_ompi_mpi_byte_00123d70)[recvtype - 0x8000];
  }
  else {
    icetRaiseDiagnostic("MPI Communicator received bad data type.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x12f);
    puVar1 = &ompi_mpi_byte;
  }
  MPI_Sendrecv(sendbuf,sendcount,puVar2,dest,sendtag,recvbuf,recvcount,puVar1,src,recvtag,
               *self->data,0);
  return;
}

Assistant:

static void Sendrecv(IceTCommunicator self,
                     const void *sendbuf,
                     int sendcount,
                     IceTEnum sendtype,
                     int dest,
                     int sendtag,
                     void *recvbuf,
                     int recvcount,
                     IceTEnum recvtype,
                     int src,
                     int recvtag)
{
    MPI_Datatype mpisendtype;
    MPI_Datatype mpirecvtype;
    CONVERT_DATATYPE(sendtype, mpisendtype);
    CONVERT_DATATYPE(recvtype, mpirecvtype);

    MPI_Sendrecv((void *)sendbuf, sendcount, mpisendtype, dest, sendtag,
                 recvbuf, recvcount, mpirecvtype, src, recvtag, MPI_COMM,
                 MPI_STATUS_IGNORE);
}